

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QPoint>::resize(QList<QPoint> *this,qsizetype size)

{
  resize_internal(this,size);
  if ((this->d).size < size) {
    QArrayDataPointer<QPoint>::appendInitialize(&this->d,size);
    return;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }